

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_257,_false,_embree::avx::VirtualCurveIntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  vfloat<4> vVar9;
  byte bVar10;
  BVH *bvh;
  size_t sVar11;
  void *pvVar12;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar13;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar14;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined8 uVar19;
  undefined8 uVar20;
  vbool<4> vVar21;
  size_t sVar22;
  char cVar23;
  bool bVar24;
  uint uVar25;
  undefined4 uVar26;
  int iVar27;
  uint uVar28;
  ulong uVar29;
  long lVar30;
  size_t sVar31;
  NodeRef root;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar32;
  NodeRef *pNVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar55;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  vfloat4 a0;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar65;
  float fVar70;
  float fVar71;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar72;
  float fVar73;
  float fVar81;
  float fVar82;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar83;
  undefined1 auVar80 [64];
  float fVar84;
  float fVar89;
  float fVar90;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar91;
  float fVar92;
  float fVar95;
  float fVar96;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar97;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [64];
  vbool<4> terminated;
  undefined4 local_18a8 [4];
  TravRayK<4,_false> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar20 = mm_lookupmask_ps._8_8_;
  uVar19 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  sVar31 = (bvh->root).ptr;
  if (sVar31 != 8) {
    auVar46 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar61 = vpcmpeqd_avx(auVar46,(undefined1  [16])valid_i->field_0);
    auVar46 = *(undefined1 (*) [16])(ray + 0x80);
    auVar39 = ZEXT816(0) << 0x40;
    auVar41 = vcmpps_avx(auVar46,auVar39,5);
    auVar41 = vandps_avx(auVar41,auVar61);
    uVar28 = vmovmskps_avx(auVar41);
    if (uVar28 != 0) {
      uVar29 = (ulong)(uVar28 & 0xff);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar53._0_4_ =
           tray.dir.field_0._0_4_ * tray.dir.field_0._0_4_ +
           tray.dir.field_0._32_4_ * tray.dir.field_0._32_4_ +
           tray.dir.field_0._16_4_ * tray.dir.field_0._16_4_;
      auVar53._4_4_ =
           tray.dir.field_0._4_4_ * tray.dir.field_0._4_4_ +
           tray.dir.field_0._36_4_ * tray.dir.field_0._36_4_ +
           tray.dir.field_0._20_4_ * tray.dir.field_0._20_4_;
      auVar53._8_4_ =
           tray.dir.field_0._8_4_ * tray.dir.field_0._8_4_ +
           tray.dir.field_0._40_4_ * tray.dir.field_0._40_4_ +
           tray.dir.field_0._24_4_ * tray.dir.field_0._24_4_;
      auVar53._12_4_ =
           tray.dir.field_0._12_4_ * tray.dir.field_0._12_4_ +
           tray.dir.field_0._44_4_ * tray.dir.field_0._44_4_ +
           tray.dir.field_0._28_4_ * tray.dir.field_0._28_4_;
      auVar61 = vrsqrtps_avx(auVar53);
      fVar55 = auVar61._0_4_;
      fVar58 = auVar61._4_4_;
      fVar59 = auVar61._8_4_;
      fVar60 = auVar61._12_4_;
      pre.depth_scale.field_0.v[0] = fVar55 * 1.5 + fVar55 * fVar55 * fVar55 * auVar53._0_4_ * -0.5;
      pre.depth_scale.field_0.v[1] = fVar58 * 1.5 + fVar58 * fVar58 * fVar58 * auVar53._4_4_ * -0.5;
      pre.depth_scale.field_0.v[2] = fVar59 * 1.5 + fVar59 * fVar59 * fVar59 * auVar53._8_4_ * -0.5;
      pre.depth_scale.field_0.v[3] = fVar60 * 1.5 + fVar60 * fVar60 * fVar60 * auVar53._12_4_ * -0.5
      ;
      while (uVar29 != 0) {
        lVar30 = 0;
        if (uVar29 != 0) {
          for (; (uVar29 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
          }
        }
        auVar61 = vinsertps_avx(ZEXT416(*(uint *)(ray + lVar30 * 4 + 0x40)),
                                ZEXT416(*(uint *)(ray + lVar30 * 4 + 0x50)),0x1c);
        auVar61 = vinsertps_avx(auVar61,ZEXT416(*(uint *)(ray + lVar30 * 4 + 0x60)),0x28);
        fVar55 = *(float *)((long)pre.ray_space + lVar30 * 4 + -0x10);
        auVar63._0_4_ = auVar61._0_4_ * fVar55;
        auVar63._4_4_ = auVar61._4_4_ * fVar55;
        auVar63._8_4_ = auVar61._8_4_ * fVar55;
        auVar63._12_4_ = auVar61._12_4_ * fVar55;
        auVar53 = vshufpd_avx(auVar63,auVar63,1);
        auVar61 = vmovshdup_avx(auVar63);
        auVar93._8_4_ = 0x80000000;
        auVar93._0_8_ = 0x8000000080000000;
        auVar93._12_4_ = 0x80000000;
        auVar74._0_4_ = auVar61._0_4_ ^ 0x80000000;
        auVar61 = vunpckhps_avx(auVar63,auVar39);
        auVar74._4_12_ = ZEXT812(0) << 0x20;
        auVar66 = vshufps_avx(auVar61,auVar74,0x41);
        auVar51._0_8_ = auVar53._0_8_ ^ 0x8000000080000000;
        auVar51._8_8_ = auVar53._8_8_ ^ auVar93._8_8_;
        auVar51 = vinsertps_avx(auVar51,auVar63,0x2a);
        auVar61 = vdpps_avx(auVar66,auVar66,0x7f);
        auVar53 = vdpps_avx(auVar51,auVar51,0x7f);
        auVar61 = vcmpps_avx(auVar53,auVar61,1);
        auVar61 = vshufps_avx(auVar61,auVar61,0);
        auVar61 = vblendvps_avx(auVar51,auVar66,auVar61);
        auVar53 = vdpps_avx(auVar61,auVar61,0x7f);
        auVar51 = vrsqrtss_avx(auVar53,auVar53);
        fVar58 = auVar51._0_4_;
        auVar53 = ZEXT416((uint)(fVar58 * 1.5 - auVar53._0_4_ * 0.5 * fVar58 * fVar58 * fVar58));
        auVar53 = vshufps_avx(auVar53,auVar53,0);
        auVar66._0_4_ = auVar61._0_4_ * auVar53._0_4_;
        auVar66._4_4_ = auVar61._4_4_ * auVar53._4_4_;
        auVar66._8_4_ = auVar61._8_4_ * auVar53._8_4_;
        auVar66._12_4_ = auVar61._12_4_ * auVar53._12_4_;
        auVar61 = vshufps_avx(auVar66,auVar66,0xc9);
        auVar53 = vshufps_avx(auVar63,auVar63,0xc9);
        auVar85._0_4_ = auVar53._0_4_ * auVar66._0_4_;
        auVar85._4_4_ = auVar53._4_4_ * auVar66._4_4_;
        auVar85._8_4_ = auVar53._8_4_ * auVar66._8_4_;
        auVar85._12_4_ = auVar53._12_4_ * auVar66._12_4_;
        auVar75._0_4_ = auVar63._0_4_ * auVar61._0_4_;
        auVar75._4_4_ = auVar63._4_4_ * auVar61._4_4_;
        auVar75._8_4_ = auVar63._8_4_ * auVar61._8_4_;
        auVar75._12_4_ = auVar63._12_4_ * auVar61._12_4_;
        auVar61 = vsubps_avx(auVar75,auVar85);
        auVar51 = vshufps_avx(auVar61,auVar61,0xc9);
        auVar61 = vdpps_avx(auVar51,auVar51,0x7f);
        uVar29 = uVar29 & uVar29 - 1;
        auVar53 = vrsqrtss_avx(auVar61,auVar61);
        fVar58 = auVar53._0_4_;
        auVar61 = ZEXT416((uint)(fVar58 * 1.5 - auVar61._0_4_ * 0.5 * fVar58 * fVar58 * fVar58));
        auVar61 = vshufps_avx(auVar61,auVar61,0);
        auVar76._0_4_ = auVar61._0_4_ * auVar51._0_4_;
        auVar76._4_4_ = auVar61._4_4_ * auVar51._4_4_;
        auVar76._8_4_ = auVar61._8_4_ * auVar51._8_4_;
        auVar76._12_4_ = auVar61._12_4_ * auVar51._12_4_;
        auVar61._0_4_ = auVar63._0_4_ * fVar55;
        auVar61._4_4_ = auVar63._4_4_ * fVar55;
        auVar61._8_4_ = auVar63._8_4_ * fVar55;
        auVar61._12_4_ = auVar63._12_4_ * fVar55;
        auVar51 = vunpcklps_avx(auVar66,auVar61);
        auVar61 = vunpckhps_avx(auVar66,auVar61);
        auVar66 = vunpcklps_avx(auVar76,auVar39);
        auVar53 = vunpckhps_avx(auVar76,auVar39);
        aVar14 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar61,auVar53);
        aVar15 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar51,auVar66);
        aVar13 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar51,auVar66);
        pre.ray_space[lVar30].vx.field_0 = aVar15;
        pre.ray_space[lVar30].vy.field_0 = aVar13;
        pre.ray_space[lVar30].vz.field_0 = aVar14;
      }
      auVar67._8_4_ = 0x7fffffff;
      auVar67._0_8_ = 0x7fffffff7fffffff;
      auVar67._12_4_ = 0x7fffffff;
      auVar77._8_4_ = 0x219392ef;
      auVar77._0_8_ = 0x219392ef219392ef;
      auVar77._12_4_ = 0x219392ef;
      auVar61 = vandps_avx(auVar67,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar61 = vcmpps_avx(auVar61,auVar77,1);
      auVar61 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar77,auVar61);
      auVar86._8_4_ = 0x3f800000;
      auVar86._0_8_ = 0x3f8000003f800000;
      auVar86._12_4_ = 0x3f800000;
      auVar39 = vrcpps_avx(auVar61);
      fVar55 = auVar39._0_4_;
      auVar50._0_4_ = auVar61._0_4_ * fVar55;
      fVar58 = auVar39._4_4_;
      auVar50._4_4_ = auVar61._4_4_ * fVar58;
      fVar59 = auVar39._8_4_;
      auVar50._8_4_ = auVar61._8_4_ * fVar59;
      fVar60 = auVar39._12_4_;
      auVar50._12_4_ = auVar61._12_4_ * fVar60;
      auVar61 = vsubps_avx(auVar86,auVar50);
      tray.rdir.field_0._16_4_ = fVar55 + fVar55 * auVar61._0_4_;
      tray.rdir.field_0._20_4_ = fVar58 + fVar58 * auVar61._4_4_;
      tray.rdir.field_0._24_4_ = fVar59 + fVar59 * auVar61._8_4_;
      tray.rdir.field_0._28_4_ = fVar60 + fVar60 * auVar61._12_4_;
      auVar51 = ZEXT816(0) << 0x20;
      auVar61 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar51,5);
      auVar62._8_4_ = 0x20;
      auVar62._0_8_ = 0x2000000020;
      auVar62._12_4_ = 0x20;
      auVar64._8_4_ = 0x30;
      auVar64._0_8_ = 0x3000000030;
      auVar64._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar64,auVar62,auVar61);
      tray.org.field_0._0_4_ = (undefined4)*(undefined8 *)ray;
      tray.org.field_0._4_4_ = (undefined4)((ulong)*(undefined8 *)ray >> 0x20);
      tray.org.field_0._8_4_ = (undefined4)*(undefined8 *)(ray + 8);
      tray.org.field_0._12_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 8) >> 0x20);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x20);
      auVar61 = vandps_avx(auVar67,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar61 = vcmpps_avx(auVar61,auVar77,1);
      auVar39 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar77,auVar61);
      auVar61 = vandps_avx(auVar67,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar61 = vcmpps_avx(auVar61,auVar77,1);
      auVar61 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar77,auVar61);
      auVar53 = vrcpps_avx(auVar39);
      fVar55 = auVar53._0_4_;
      auVar42._0_4_ = auVar39._0_4_ * fVar55;
      fVar58 = auVar53._4_4_;
      auVar42._4_4_ = auVar39._4_4_ * fVar58;
      fVar59 = auVar53._8_4_;
      auVar42._8_4_ = auVar39._8_4_ * fVar59;
      fVar60 = auVar53._12_4_;
      auVar42._12_4_ = auVar39._12_4_ * fVar60;
      auVar39 = vsubps_avx(auVar86,auVar42);
      tray.rdir.field_0._0_4_ = fVar55 + fVar55 * auVar39._0_4_;
      tray.rdir.field_0._4_4_ = fVar58 + fVar58 * auVar39._4_4_;
      tray.rdir.field_0._8_4_ = fVar59 + fVar59 * auVar39._8_4_;
      tray.rdir.field_0._12_4_ = fVar60 + fVar60 * auVar39._12_4_;
      auVar39 = vrcpps_avx(auVar61);
      fVar55 = auVar39._0_4_;
      auVar38._0_4_ = auVar61._0_4_ * fVar55;
      fVar58 = auVar39._4_4_;
      auVar38._4_4_ = auVar61._4_4_ * fVar58;
      fVar59 = auVar39._8_4_;
      auVar38._8_4_ = auVar61._8_4_ * fVar59;
      fVar60 = auVar39._12_4_;
      auVar38._12_4_ = auVar61._12_4_ * fVar60;
      auVar61 = vsubps_avx(auVar86,auVar38);
      tray.rdir.field_0._32_4_ = fVar55 + fVar55 * auVar61._0_4_;
      tray.rdir.field_0._36_4_ = fVar58 + fVar58 * auVar61._4_4_;
      tray.rdir.field_0._40_4_ = fVar59 + fVar59 * auVar61._8_4_;
      tray.rdir.field_0._44_4_ = fVar60 + fVar60 * auVar61._12_4_;
      auVar61 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar51,1);
      auVar47._8_4_ = 0x10;
      auVar47._0_8_ = 0x1000000010;
      auVar47._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar61,auVar47);
      auVar61 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar51,5);
      auVar43._8_4_ = 0x40;
      auVar43._0_8_ = 0x4000000040;
      auVar43._12_4_ = 0x40;
      auVar48._8_4_ = 0x50;
      auVar48._0_8_ = 0x5000000050;
      auVar48._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar48,auVar43,auVar61);
      auVar61 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar51);
      auVar46 = vmaxps_avx(auVar46,auVar51);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar101 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar61,auVar41);
      auVar39._8_4_ = 0xff800000;
      auVar39._0_8_ = 0xff800000ff800000;
      auVar39._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar39,auVar46,auVar41);
      auVar46 = vpcmpeqd_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])tray.tfar.field_0
                            );
      terminated.field_0._0_4_ = auVar41._0_4_ ^ auVar46._0_4_;
      terminated.field_0._4_4_ = auVar41._4_4_ ^ auVar46._4_4_;
      terminated.field_0._8_4_ = auVar41._8_4_ ^ auVar46._8_4_;
      terminated.field_0._12_4_ = auVar41._12_4_ ^ auVar46._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar28 = 3;
      }
      else {
        uVar28 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar33 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar32 = &stack_near[2].field_0;
      stack_node[1].ptr = sVar31;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_00ec7252:
      do {
        do {
          root.ptr = pNVar33[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_00ec7800;
          pNVar33 = pNVar33 + -1;
          paVar32 = paVar32 + -1;
          vVar9.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar32->v;
          auVar80 = ZEXT1664((undefined1  [16])vVar9.field_0);
          auVar46 = vcmpps_avx((undefined1  [16])vVar9.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar25 = vmovmskps_avx(auVar46);
        } while (uVar25 == 0);
        uVar29 = (ulong)(uVar25 & 0xff);
        uVar25 = POPCOUNT(uVar25 & 0xff);
        if (uVar28 < uVar25) {
LAB_00ec7290:
          do {
            vVar21.field_0 = terminated.field_0;
            sVar31 = 8;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00ec7800;
              auVar46 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar80._0_16_,6);
              if ((((auVar46 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar46 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar46 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar46[0xf] < '\0') {
                bVar10 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                pvVar12 = This->leafIntersector;
                local_18a8._0_8_ = uVar19;
                local_18a8._8_8_ = uVar20;
                uVar25 = vmovmskps_avx((undefined1  [16])terminated.field_0);
                uVar29 = (ulong)(uVar25 ^ 0xf);
                while (uVar29 != 0) {
                  lVar30 = 0;
                  if (uVar29 != 0) {
                    for (; (uVar29 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                    }
                  }
                  uVar29 = uVar29 & uVar29 - 1;
                  cVar23 = (**(code **)((long)pvVar12 + (ulong)bVar10 * 0x40 + 0x18))
                                     (&pre,ray,lVar30,context,
                                      (byte *)(root.ptr & 0xfffffffffffffff0));
                  auVar101 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                  if (cVar23 != '\0') {
                    local_18a8[lVar30] = 0xffffffff;
                  }
                }
                auVar16._8_4_ = local_18a8[2];
                auVar16._12_4_ = local_18a8[3];
                auVar16._0_4_ = local_18a8[0];
                auVar16._4_4_ = local_18a8[1];
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vorps_avx((undefined1  [16])vVar21.field_0,auVar16);
                auVar46 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
                if ((((auVar46 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar46 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar46 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar46[0xf]) goto LAB_00ec7800;
                auVar45._8_4_ = 0xff800000;
                auVar45._0_8_ = 0xff800000ff800000;
                auVar45._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar45,
                                   (undefined1  [16])terminated.field_0);
              }
              goto LAB_00ec7252;
            }
            uVar29 = root.ptr & 0xfffffffffffffff0;
            auVar46 = auVar101._0_16_;
            for (lVar30 = 0x1c;
                (auVar80 = ZEXT1664(auVar46), lVar30 != 0x20 &&
                (sVar11 = *(size_t *)((uVar29 - 0xe0) + lVar30 * 8), sVar11 != 8));
                lVar30 = lVar30 + 1) {
              if ((root.ptr & 7) == 0) {
                uVar26 = *(undefined4 *)((root.ptr - 0x50) + lVar30 * 4);
                auVar34._4_4_ = uVar26;
                auVar34._0_4_ = uVar26;
                auVar34._8_4_ = uVar26;
                auVar34._12_4_ = uVar26;
                auVar17._4_4_ = tray.org.field_0._4_4_;
                auVar17._0_4_ = tray.org.field_0._0_4_;
                auVar17._8_4_ = tray.org.field_0._8_4_;
                auVar17._12_4_ = tray.org.field_0._12_4_;
                auVar18._8_8_ = tray.org.field_0._24_8_;
                auVar18._0_8_ = tray.org.field_0._16_8_;
                auVar61 = vsubps_avx(auVar34,auVar17);
                auVar44._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar61._0_4_;
                auVar44._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar61._4_4_;
                auVar44._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar61._8_4_;
                auVar44._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar61._12_4_;
                uVar26 = *(undefined4 *)((root.ptr - 0x30) + lVar30 * 4);
                auVar35._4_4_ = uVar26;
                auVar35._0_4_ = uVar26;
                auVar35._8_4_ = uVar26;
                auVar35._12_4_ = uVar26;
                auVar61 = vsubps_avx(auVar35,auVar18);
                auVar40._0_4_ = (float)tray.rdir.field_0._16_4_ * auVar61._0_4_;
                auVar40._4_4_ = (float)tray.rdir.field_0._20_4_ * auVar61._4_4_;
                auVar40._8_4_ = (float)tray.rdir.field_0._24_4_ * auVar61._8_4_;
                auVar40._12_4_ = (float)tray.rdir.field_0._28_4_ * auVar61._12_4_;
                uVar26 = *(undefined4 *)((root.ptr - 0x10) + lVar30 * 4);
                auVar36._4_4_ = uVar26;
                auVar36._0_4_ = uVar26;
                auVar36._8_4_ = uVar26;
                auVar36._12_4_ = uVar26;
                auVar61 = vsubps_avx(auVar36,(undefined1  [16])tray.org.field_0.field_0.z.field_0);
                auVar37._0_4_ = tray.rdir.field_0._32_4_ * auVar61._0_4_;
                auVar37._4_4_ = tray.rdir.field_0._36_4_ * auVar61._4_4_;
                auVar37._8_4_ = tray.rdir.field_0._40_4_ * auVar61._8_4_;
                auVar37._12_4_ = tray.rdir.field_0._44_4_ * auVar61._12_4_;
                uVar26 = *(undefined4 *)((root.ptr - 0x40) + lVar30 * 4);
                auVar68._4_4_ = uVar26;
                auVar68._0_4_ = uVar26;
                auVar68._8_4_ = uVar26;
                auVar68._12_4_ = uVar26;
                auVar61 = vsubps_avx(auVar68,auVar17);
                auVar49._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar61._0_4_;
                auVar49._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar61._4_4_;
                auVar49._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar61._8_4_;
                auVar49._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar61._12_4_;
                uVar26 = *(undefined4 *)((root.ptr - 0x20) + lVar30 * 4);
                auVar56._4_4_ = uVar26;
                auVar56._0_4_ = uVar26;
                auVar56._8_4_ = uVar26;
                auVar56._12_4_ = uVar26;
                auVar61 = vsubps_avx(auVar56,auVar18);
                auVar52._0_4_ = (float)tray.rdir.field_0._16_4_ * auVar61._0_4_;
                auVar52._4_4_ = (float)tray.rdir.field_0._20_4_ * auVar61._4_4_;
                auVar52._8_4_ = (float)tray.rdir.field_0._24_4_ * auVar61._8_4_;
                auVar52._12_4_ = (float)tray.rdir.field_0._28_4_ * auVar61._12_4_;
                uVar26 = *(undefined4 *)(root.ptr + lVar30 * 4);
                auVar57._4_4_ = uVar26;
                auVar57._0_4_ = uVar26;
                auVar57._8_4_ = uVar26;
                auVar57._12_4_ = uVar26;
                auVar61 = vsubps_avx(auVar57,(undefined1  [16])tray.org.field_0.field_0.z.field_0);
                auVar54._0_4_ = tray.rdir.field_0._32_4_ * auVar61._0_4_;
                auVar54._4_4_ = tray.rdir.field_0._36_4_ * auVar61._4_4_;
                auVar54._8_4_ = tray.rdir.field_0._40_4_ * auVar61._8_4_;
                auVar54._12_4_ = tray.rdir.field_0._44_4_ * auVar61._12_4_;
              }
              else {
                fVar55 = *(float *)((uVar29 - 0x50) + lVar30 * 4);
                fVar58 = *(float *)((uVar29 - 0x40) + lVar30 * 4);
                fVar59 = *(float *)((uVar29 - 0x30) + lVar30 * 4);
                fVar60 = *(float *)((uVar29 - 0x20) + lVar30 * 4);
                fVar1 = *(float *)((uVar29 - 0x10) + lVar30 * 4);
                fVar2 = *(float *)(uVar29 + lVar30 * 4);
                fVar3 = *(float *)(uVar29 + 0x10 + lVar30 * 4);
                fVar4 = *(float *)(uVar29 + 0x20 + lVar30 * 4);
                fVar5 = *(float *)(uVar29 + 0x30 + lVar30 * 4);
                auVar78._0_4_ =
                     (float)tray.dir.field_0._0_4_ * fVar55 +
                     (float)tray.dir.field_0._16_4_ * fVar60 +
                     fVar3 * (float)tray.dir.field_0._32_4_;
                auVar78._4_4_ =
                     (float)tray.dir.field_0._4_4_ * fVar55 +
                     (float)tray.dir.field_0._20_4_ * fVar60 +
                     fVar3 * (float)tray.dir.field_0._36_4_;
                auVar78._8_4_ =
                     (float)tray.dir.field_0._8_4_ * fVar55 +
                     (float)tray.dir.field_0._24_4_ * fVar60 +
                     fVar3 * (float)tray.dir.field_0._40_4_;
                auVar78._12_4_ =
                     (float)tray.dir.field_0._12_4_ * fVar55 +
                     (float)tray.dir.field_0._28_4_ * fVar60 +
                     fVar3 * (float)tray.dir.field_0._44_4_;
                auVar87._0_4_ =
                     (float)tray.dir.field_0._0_4_ * fVar58 +
                     (float)tray.dir.field_0._16_4_ * fVar1 + (float)tray.dir.field_0._32_4_ * fVar4
                ;
                auVar87._4_4_ =
                     (float)tray.dir.field_0._4_4_ * fVar58 +
                     (float)tray.dir.field_0._20_4_ * fVar1 + (float)tray.dir.field_0._36_4_ * fVar4
                ;
                auVar87._8_4_ =
                     (float)tray.dir.field_0._8_4_ * fVar58 +
                     (float)tray.dir.field_0._24_4_ * fVar1 + (float)tray.dir.field_0._40_4_ * fVar4
                ;
                auVar87._12_4_ =
                     (float)tray.dir.field_0._12_4_ * fVar58 +
                     (float)tray.dir.field_0._28_4_ * fVar1 + (float)tray.dir.field_0._44_4_ * fVar4
                ;
                auVar69._0_4_ =
                     (float)tray.dir.field_0._0_4_ * fVar59 +
                     (float)tray.dir.field_0._16_4_ * fVar2 + (float)tray.dir.field_0._32_4_ * fVar5
                ;
                auVar69._4_4_ =
                     (float)tray.dir.field_0._4_4_ * fVar59 +
                     (float)tray.dir.field_0._20_4_ * fVar2 + (float)tray.dir.field_0._36_4_ * fVar5
                ;
                auVar69._8_4_ =
                     (float)tray.dir.field_0._8_4_ * fVar59 +
                     (float)tray.dir.field_0._24_4_ * fVar2 + (float)tray.dir.field_0._40_4_ * fVar5
                ;
                auVar69._12_4_ =
                     (float)tray.dir.field_0._12_4_ * fVar59 +
                     (float)tray.dir.field_0._28_4_ * fVar2 + (float)tray.dir.field_0._44_4_ * fVar5
                ;
                auVar98._8_4_ = 0x7fffffff;
                auVar98._0_8_ = 0x7fffffff7fffffff;
                auVar98._12_4_ = 0x7fffffff;
                auVar61 = vandps_avx(auVar78,auVar98);
                auVar99._8_4_ = 0x219392ef;
                auVar99._0_8_ = 0x219392ef219392ef;
                auVar99._12_4_ = 0x219392ef;
                auVar61 = vcmpps_avx(auVar61,auVar99,1);
                auVar39 = vblendvps_avx(auVar78,auVar99,auVar61);
                auVar61 = vandps_avx(auVar87,auVar98);
                auVar61 = vcmpps_avx(auVar61,auVar99,1);
                auVar53 = vblendvps_avx(auVar87,auVar99,auVar61);
                auVar61 = vandps_avx(auVar69,auVar98);
                auVar61 = vcmpps_avx(auVar61,auVar99,1);
                auVar61 = vblendvps_avx(auVar69,auVar99,auVar61);
                fVar6 = *(float *)(uVar29 + 0x40 + lVar30 * 4);
                auVar51 = vrcpps_avx(auVar39);
                fVar65 = auVar51._0_4_;
                auVar79._0_4_ = fVar65 * auVar39._0_4_;
                fVar70 = auVar51._4_4_;
                auVar79._4_4_ = fVar70 * auVar39._4_4_;
                fVar71 = auVar51._8_4_;
                auVar79._8_4_ = fVar71 * auVar39._8_4_;
                fVar72 = auVar51._12_4_;
                auVar79._12_4_ = fVar72 * auVar39._12_4_;
                auVar100._8_4_ = 0x3f800000;
                auVar100._0_8_ = 0x3f8000003f800000;
                auVar100._12_4_ = 0x3f800000;
                auVar39 = vsubps_avx(auVar100,auVar79);
                fVar65 = fVar65 + fVar65 * auVar39._0_4_;
                fVar70 = fVar70 + fVar70 * auVar39._4_4_;
                fVar71 = fVar71 + fVar71 * auVar39._8_4_;
                fVar72 = fVar72 + fVar72 * auVar39._12_4_;
                auVar39 = vrcpps_avx(auVar53);
                fVar73 = auVar39._0_4_;
                auVar88._0_4_ = fVar73 * auVar53._0_4_;
                fVar81 = auVar39._4_4_;
                auVar88._4_4_ = fVar81 * auVar53._4_4_;
                fVar82 = auVar39._8_4_;
                auVar88._8_4_ = fVar82 * auVar53._8_4_;
                fVar83 = auVar39._12_4_;
                auVar88._12_4_ = fVar83 * auVar53._12_4_;
                auVar39 = vsubps_avx(auVar100,auVar88);
                fVar73 = fVar73 + fVar73 * auVar39._0_4_;
                fVar81 = fVar81 + fVar81 * auVar39._4_4_;
                fVar82 = fVar82 + fVar82 * auVar39._8_4_;
                fVar83 = fVar83 + fVar83 * auVar39._12_4_;
                auVar39 = vrcpps_avx(auVar61);
                fVar84 = auVar39._0_4_;
                auVar94._0_4_ = fVar84 * auVar61._0_4_;
                fVar89 = auVar39._4_4_;
                auVar94._4_4_ = fVar89 * auVar61._4_4_;
                fVar90 = auVar39._8_4_;
                auVar94._8_4_ = fVar90 * auVar61._8_4_;
                fVar91 = auVar39._12_4_;
                auVar94._12_4_ = fVar91 * auVar61._12_4_;
                auVar61 = vsubps_avx(auVar100,auVar94);
                fVar84 = fVar84 + fVar84 * auVar61._0_4_;
                fVar89 = fVar89 + fVar89 * auVar61._4_4_;
                fVar90 = fVar90 + fVar90 * auVar61._8_4_;
                fVar91 = fVar91 + fVar91 * auVar61._12_4_;
                fVar7 = *(float *)(uVar29 + 0x50 + lVar30 * 4);
                fVar8 = *(float *)(uVar29 + 0x60 + lVar30 * 4);
                fVar92 = (float)tray.org.field_0._16_8_;
                fVar95 = (float)((ulong)tray.org.field_0._16_8_ >> 0x20);
                fVar96 = (float)tray.org.field_0._24_8_;
                fVar97 = (float)((ulong)tray.org.field_0._24_8_ >> 0x20);
                auVar44._0_4_ =
                     (fVar55 * (float)tray.org.field_0._0_4_ +
                     fVar6 + fVar3 * (float)tray.org.field_0._32_4_ + fVar92 * fVar60) * -fVar65;
                auVar44._4_4_ =
                     (fVar55 * (float)tray.org.field_0._4_4_ +
                     fVar6 + fVar3 * (float)tray.org.field_0._36_4_ + fVar95 * fVar60) * -fVar70;
                auVar44._8_4_ =
                     (fVar55 * (float)tray.org.field_0._8_4_ +
                     fVar6 + fVar3 * (float)tray.org.field_0._40_4_ + fVar96 * fVar60) * -fVar71;
                auVar44._12_4_ =
                     (fVar55 * (float)tray.org.field_0._12_4_ +
                     fVar6 + fVar3 * (float)tray.org.field_0._44_4_ + fVar97 * fVar60) * -fVar72;
                auVar40._0_4_ =
                     (fVar58 * (float)tray.org.field_0._0_4_ +
                     fVar92 * fVar1 + fVar7 + (float)tray.org.field_0._32_4_ * fVar4) * -fVar73;
                auVar40._4_4_ =
                     (fVar58 * (float)tray.org.field_0._4_4_ +
                     fVar95 * fVar1 + fVar7 + (float)tray.org.field_0._36_4_ * fVar4) * -fVar81;
                auVar40._8_4_ =
                     (fVar58 * (float)tray.org.field_0._8_4_ +
                     fVar96 * fVar1 + fVar7 + (float)tray.org.field_0._40_4_ * fVar4) * -fVar82;
                auVar40._12_4_ =
                     (fVar58 * (float)tray.org.field_0._12_4_ +
                     fVar97 * fVar1 + fVar7 + (float)tray.org.field_0._44_4_ * fVar4) * -fVar83;
                auVar37._0_4_ =
                     (fVar59 * (float)tray.org.field_0._0_4_ +
                     fVar92 * fVar2 + fVar8 + (float)tray.org.field_0._32_4_ * fVar5) * -fVar84;
                auVar37._4_4_ =
                     (fVar59 * (float)tray.org.field_0._4_4_ +
                     fVar95 * fVar2 + fVar8 + (float)tray.org.field_0._36_4_ * fVar5) * -fVar89;
                auVar37._8_4_ =
                     (fVar59 * (float)tray.org.field_0._8_4_ +
                     fVar96 * fVar2 + fVar8 + (float)tray.org.field_0._40_4_ * fVar5) * -fVar90;
                auVar37._12_4_ =
                     (fVar59 * (float)tray.org.field_0._12_4_ +
                     fVar97 * fVar2 + fVar8 + (float)tray.org.field_0._44_4_ * fVar5) * -fVar91;
                auVar49._0_4_ = fVar65 + auVar44._0_4_;
                auVar49._4_4_ = fVar70 + auVar44._4_4_;
                auVar49._8_4_ = fVar71 + auVar44._8_4_;
                auVar49._12_4_ = fVar72 + auVar44._12_4_;
                auVar52._0_4_ = fVar73 + auVar40._0_4_;
                auVar52._4_4_ = fVar81 + auVar40._4_4_;
                auVar52._8_4_ = fVar82 + auVar40._8_4_;
                auVar52._12_4_ = fVar83 + auVar40._12_4_;
                auVar54._0_4_ = fVar84 + auVar37._0_4_;
                auVar54._4_4_ = fVar89 + auVar37._4_4_;
                auVar54._8_4_ = fVar90 + auVar37._8_4_;
                auVar54._12_4_ = fVar91 + auVar37._12_4_;
              }
              auVar61 = vpminsd_avx(auVar44,auVar49);
              auVar39 = vpminsd_avx(auVar40,auVar52);
              auVar61 = vpmaxsd_avx(auVar61,auVar39);
              auVar39 = vpminsd_avx(auVar37,auVar54);
              auVar53 = vpmaxsd_avx(auVar61,auVar39);
              auVar61 = vpmaxsd_avx(auVar44,auVar49);
              auVar39 = vpmaxsd_avx(auVar40,auVar52);
              auVar39 = vpminsd_avx(auVar61,auVar39);
              auVar61 = vpmaxsd_avx(auVar37,auVar54);
              auVar39 = vpminsd_avx(auVar39,auVar61);
              auVar61 = vpmaxsd_avx(auVar53,(undefined1  [16])tray.tnear.field_0);
              auVar39 = vpminsd_avx(auVar39,(undefined1  [16])tray.tfar.field_0);
              auVar39 = vcmpps_avx(auVar61,auVar39,2);
              sVar22 = sVar31;
              auVar61 = auVar46;
              if (((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar39[0xf] < '\0') &&
                 (auVar61 = vblendvps_avx(auVar101._0_16_,auVar53,auVar39), sVar22 = sVar11,
                 sVar31 != 8)) {
                pNVar33->ptr = sVar31;
                pNVar33 = pNVar33 + 1;
                *(undefined1 (*) [16])paVar32->v = auVar46;
                paVar32 = paVar32 + 1;
              }
              auVar46 = auVar61;
              sVar31 = sVar22;
            }
            if (sVar31 == 8) goto LAB_00ec7617;
            auVar61 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar46,6);
            uVar26 = vmovmskps_avx(auVar61);
            root.ptr = sVar31;
          } while ((byte)uVar28 < (byte)POPCOUNT(uVar26));
          pNVar33->ptr = sVar31;
          pNVar33 = pNVar33 + 1;
          *(undefined1 (*) [16])paVar32->v = auVar46;
          paVar32 = paVar32 + 1;
LAB_00ec7617:
          iVar27 = 4;
        }
        else {
          while (uVar29 != 0) {
            sVar31 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> sVar31 & 1) == 0; sVar31 = sVar31 + 1) {
              }
            }
            uVar29 = uVar29 & uVar29 - 1;
            bVar24 = occluded1(This,bvh,root,sVar31,&pre,ray,&tray,context);
            if (bVar24) {
              terminated.field_0.i[sVar31] = -1;
            }
          }
          auVar46 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
          iVar27 = 3;
          auVar101 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar80 = ZEXT1664((undefined1  [16])vVar9.field_0);
          if ((((auVar46 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar46 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar46 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar46[0xf] < '\0') {
            auVar46._8_4_ = 0xff800000;
            auVar46._0_8_ = 0xff800000ff800000;
            auVar46._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar46,
                               (undefined1  [16])terminated.field_0);
            iVar27 = 2;
          }
          if (uVar28 < uVar25) goto LAB_00ec7290;
        }
      } while (iVar27 != 3);
LAB_00ec7800:
      auVar46 = vandps_avx(auVar41,(undefined1  [16])terminated.field_0);
      auVar41._8_4_ = 0xff800000;
      auVar41._0_8_ = 0xff800000ff800000;
      auVar41._12_4_ = 0xff800000;
      auVar46 = vmaskmovps_avx(auVar46,auVar41);
      *(undefined1 (*) [16])(ray + 0x80) = auVar46;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }